

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

char * __thiscall AActor::GetTag(AActor *this,char *def)

{
  int iVar1;
  char *pcVar2;
  undefined4 extraout_var;
  
  if (this->Tag == (FString *)0x0) {
    if (def == (char *)0x0) {
      if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar1 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
        (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar1);
      }
      def = FName::NameData.NameArray
            [(((this->super_DThinker).super_DObject.Class)->super_PNativeStruct).super_PStruct.
             super_PNamedType.TypeName.Index].Text;
    }
  }
  else {
    def = this->Tag->Chars;
    if (*def == '$') {
      pcVar2 = FStringTable::operator()(&GStrings,def + 1);
      return pcVar2;
    }
  }
  return def;
}

Assistant:

const char *AActor::GetTag(const char *def) const
{
	if (Tag != NULL)
	{
		const char *tag = Tag->GetChars();
		if (tag[0] == '$')
		{
			return GStrings(tag + 1);
		}
		else
		{
			return tag;
		}
	}
	else if (def)
	{
		return def;
	}
	else
	{
		return GetClass()->TypeName.GetChars();
	}
}